

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void new_localvar(LexState *ls,TString *name,int n)

{
  FuncState *fs_00;
  GCObject *o;
  GCObject *pGVar1;
  unsigned_short uVar2;
  int iVar3;
  undefined8 *puVar4;
  FuncState *fs;
  long lVar5;
  
  fs_00 = ls->fs;
  if ((int)((uint)fs_00->nactvar + n) < 200) {
    o = (GCObject *)fs_00->f;
    iVar3 = (o->p).sizelocvars;
    lVar5 = (long)iVar3;
    if (fs_00->nlocvars < iVar3) {
      pGVar1 = (o->h).gclist;
    }
    else {
      pGVar1 = (GCObject *)
               luaM_growaux_(ls->L,(o->h).gclist,&(o->p).sizelocvars,0x10,0x7fff,
                             "too many local variables");
      (o->h).gclist = pGVar1;
      iVar3 = (o->p).sizelocvars;
    }
    puVar4 = (undefined8 *)(lVar5 * 0x10 + (long)pGVar1);
    for (; lVar5 < iVar3; lVar5 = lVar5 + 1) {
      *puVar4 = 0;
      puVar4 = puVar4 + 2;
    }
    uVar2 = fs_00->nlocvars;
    *(TString **)((long)pGVar1 + (long)(short)uVar2 * 0x10) = name;
    if ((((name->tsv).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
      luaC_barrierf(ls->L,o,(GCObject *)name);
      uVar2 = fs_00->nlocvars;
    }
    fs_00->nlocvars = uVar2 + 1;
    fs_00->actvar[(long)n + (ulong)fs_00->nactvar] = uVar2;
    return;
  }
  errorlimit(fs_00,200,"local variables");
}

Assistant:

static void new_localvar(LexState*ls,TString*name,int n){
FuncState*fs=ls->fs;
luaY_checklimit(fs,fs->nactvar+n+1,200,"local variables");
fs->actvar[fs->nactvar+n]=cast(unsigned short,registerlocalvar(ls,name));
}